

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::operator==(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ExprPtr EVar3;
  RelationalKind local_4c;
  tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_48;
  
  bVar1 = equal(lhs,rhs);
  if (bVar1) {
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)true_);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_4c = kEQUAL;
    std::
    tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::
    tuple<mathiu::impl::RelationalKind,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_true,_true>
              (&local_48,&local_4c,lhs,rhs);
    std::
    make_shared<mathiu::impl::Expr_const,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
              ((tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                *)this);
    std::
    _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                    *)&local_48);
    _Var2._M_pi = extraout_RDX_00;
  }
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator==(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return true_;
        }
        return makeSharedExprPtr(Relational{RelationalKind::kEQUAL, lhs, rhs});
    }